

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_trace_v2(sqlite3 *db,uint mTrace,_func_int_uint_void_ptr_void_ptr_void_ptr *xTrace,
                    void *pArg)

{
  undefined8 in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 local_18;
  undefined4 local_c;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c3c9);
  local_18 = in_RDX;
  if (in_ESI == 0) {
    local_18 = 0;
  }
  local_c = in_ESI;
  if (local_18 == 0) {
    local_c = 0;
  }
  *(char *)(in_RDI + 0x6e) = (char)local_c;
  *(long *)(in_RDI + 0xf0) = local_18;
  *(undefined8 *)(in_RDI + 0xf8) = in_RCX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c427);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_trace_v2(
  sqlite3 *db,                               /* Trace this connection */
  unsigned mTrace,                           /* Mask of events to be traced */
  int(*xTrace)(unsigned,void*,void*,void*),  /* Callback to invoke */
  void *pArg                                 /* Context */
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( mTrace==0 ) xTrace = 0;
  if( xTrace==0 ) mTrace = 0;
  db->mTrace = mTrace;
  db->trace.xV2 = xTrace;
  db->pTraceArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}